

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.cpp
# Opt level: O0

void llvm::report_bad_alloc_error(char *Reason,bool GenCrashDiag)

{
  fatal_error_handler_t p_Var1;
  void *pvVar2;
  bad_alloc *this;
  allocator<char> local_49;
  string local_48;
  void *local_28;
  void *HandlerData;
  fatal_error_handler_t Handler;
  char *pcStack_10;
  bool GenCrashDiag_local;
  char *Reason_local;
  
  pvVar2 = BadAllocErrorHandlerUserData;
  p_Var1 = BadAllocErrorHandler_abi_cxx11_;
  HandlerData = BadAllocErrorHandler_abi_cxx11_;
  local_28 = BadAllocErrorHandlerUserData;
  Handler._7_1_ = GenCrashDiag;
  pcStack_10 = Reason;
  if (BadAllocErrorHandler_abi_cxx11_ != (fatal_error_handler_t)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,Reason,&local_49);
    (*p_Var1)(pvVar2,&local_48,(bool)(Handler._7_1_ & 1));
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    llvm_unreachable_internal
              ("bad alloc handler should not return",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/ErrorHandling.cpp"
               ,0xa7);
  }
  this = (bad_alloc *)__cxa_allocate_exception(8);
  std::bad_alloc::bad_alloc(this);
  __cxa_throw(this,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void llvm::report_bad_alloc_error(const char *Reason, bool GenCrashDiag) {
  fatal_error_handler_t Handler = nullptr;
  void *HandlerData = nullptr;
  {
    // Only acquire the mutex while reading the handler, so as not to invoke a
    // user-supplied callback under a lock.
#if LLVM_ENABLE_THREADS == 1
    std::lock_guard<std::mutex> Lock(BadAllocErrorHandlerMutex);
#endif
    Handler = BadAllocErrorHandler;
    HandlerData = BadAllocErrorHandlerUserData;
  }

  if (Handler) {
    Handler(HandlerData, Reason, GenCrashDiag);
    llvm_unreachable("bad alloc handler should not return");
  }

#ifdef LLVM_ENABLE_EXCEPTIONS
  // If exceptions are enabled, make OOM in malloc look like OOM in new.
  throw std::bad_alloc();
#else
  // Don't call the normal error handler. It may allocate memory. Directly write
  // an OOM to stderr and abort.
  char OOMMessage[] = "LLVM ERROR: out of memory\n";
  ssize_t written = ::write(2, OOMMessage, strlen(OOMMessage));
  (void)written;
  abort();
#endif
}